

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::ArrayElement::visitExpressions
          (ArrayElement *this,ExpressionVisitorFn fn,AccessType mode)

{
  bool bVar1;
  Expression *pEVar2;
  pool_ref<soul::heart::Expression> local_48;
  pool_ptr<soul::heart::Expression> local_40 [3];
  pool_ptr<soul::heart::Expression> local_28;
  pool_ref<soul::heart::Expression> ref;
  AccessType mode_local;
  ExpressionVisitorFn fn_local;
  ArrayElement *this_local;
  
  ref.object._4_4_ = mode;
  bVar1 = isDynamic(this);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::heart::Expression>::operator->(&this->dynamicIndex);
    (*(pEVar2->super_Object)._vptr_Object[3])(pEVar2,fn);
    pool_ptr<soul::heart::Expression>::getAsPoolRef(&local_28);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,(pool_ref<soul::heart::Expression> *)&local_28,read);
    pool_ref::operator_cast_to_pool_ptr((pool_ref *)local_40);
    (this->dynamicIndex).object = local_40[0].object;
    pool_ptr<soul::heart::Expression>::~pool_ptr(local_40);
    pool_ref<soul::heart::Expression>::~pool_ref((pool_ref<soul::heart::Expression> *)&local_28);
  }
  pEVar2 = pool_ref<soul::heart::Expression>::operator->(&this->parent);
  (*(pEVar2->super_Object)._vptr_Object[3])(pEVar2,fn,(ulong)ref.object._4_4_);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->parent,ref.object._4_4_);
  local_48.object = (this->parent).object;
  bVar1 = soul::operator!=(&local_48,this);
  checkAssertion(bVar1,"parent != *this","visitExpressions",0x22f);
  pool_ref<soul::heart::Expression>::~pool_ref(&local_48);
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn, AccessType mode) override
        {
            if (isDynamic())
            {
                dynamicIndex->visitExpressions (fn, AccessType::read);
                auto ref = dynamicIndex.getAsPoolRef();
                fn (ref, AccessType::read);
                dynamicIndex = ref;
            }

            parent->visitExpressions (fn, mode);
            fn (parent, mode);
            SOUL_ASSERT (parent != *this);
        }